

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O3

void * Js::JavascriptOperators::AllocMemForVarArray(size_t size,Recycler *recycler)

{
  char *pcVar1;
  undefined1 local_40 [8];
  TrackAllocData data;
  
  data.plusSize = size >> 3;
  local_40 = (undefined1  [8])&void*::typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.count = (size_t)anon_var_dwarf_4e91f59;
  data.filename._0_4_ = 0x276f;
  Memory::Recycler::TrackAllocInfo(recycler,(TrackAllocData *)local_40);
  pcVar1 = Memory::Recycler::AllocZeroWithAttributes<(Memory::ObjectInfoBits)256,false>
                     (recycler,size);
  return pcVar1;
}

Assistant:

void * JavascriptOperators::AllocMemForVarArray(size_t size, Recycler* recycler)
    {
        TRACK_ALLOC_INFO(recycler, Js::Var, Recycler, 0, (size_t)(size / sizeof(Js::Var)));
        return recycler->AllocZero(size);
    }